

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_string.c
# Opt level: O3

char * cmime_string_chomp(char *s)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  uint __c;
  
  sVar2 = strlen(s);
  bVar1 = s[sVar2 - 1];
  __c = (uint)bVar1;
  if (bVar1 != 0xd) {
    if (bVar1 == 0xc) {
      __c = 0xc;
    }
    else {
      if (bVar1 != 10) {
        return s;
      }
      pcVar3 = strrchr(s,0xd);
      if (pcVar3 != (char *)0x0) goto LAB_0010967c;
      __c = 10;
    }
  }
  pcVar3 = strrchr(s,__c);
LAB_0010967c:
  *pcVar3 = '\0';
  return s;
}

Assistant:

char *cmime_string_chomp(char *s) {
    char *p = NULL;
    
    switch(s[strlen(s)-1]) {
        case '\n':
            if((p = strrchr(s,'\r')) != NULL ) *p = '\0';
            else *(p = strrchr(s,'\n')) = '\0';
            break;
        case '\r':
            *(p = strrchr(s,'\r')) = '\0';
            break;
        case '\x0c':
            *(p = strrchr(s,'\x0c')) = '\0';
            break;
    }

    return(s);
}